

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::print_const_constructor
          (t_netstd_generator *this,ostream *out,
          vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  t_type *type;
  t_const_value *value;
  ostream *poVar1;
  pointer pptVar2;
  t_netstd_generator *this_00;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_70);
  this_00 = (t_netstd_generator *)0x2e5fdd;
  poVar1 = std::operator<<(poVar1,"static ");
  make_valid_csharp_identifier
            (&local_90,this_00,&(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar1 = std::operator<<(poVar1,local_90._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1,"Constants()");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  for (pptVar2 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar2 !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar2)->name_);
    type = (*pptVar2)->type_;
    value = (*pptVar2)->value_;
    std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
    print_const_def_value(this,out,&local_50,type,value);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_netstd_generator::print_const_constructor(ostream& out, vector<t_const*> consts)
{
    out << indent() << "static " << make_valid_csharp_identifier(program_name_).c_str() << "Constants()" << endl;
    scope_up(out);

    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter)
    {
        string name = (*c_iter)->get_name();
        t_type* type = (*c_iter)->get_type();
        t_const_value* value = (*c_iter)->get_value();

        print_const_def_value(out, name, type, value);
    }
    scope_down(out);
}